

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

ppcmas_tlb_t * booke206_cur_tlb(CPUPPCState_conflict2 *env)

{
  uint uVar1;
  ppcmas_tlb_t *ppVar2;
  uint tlbn;
  
  uVar1 = (uint)env->spr[0x270];
  tlbn = uVar1 >> 0x1c & 3;
  if (((uVar1 >> 0xe & 1) != 0) && ((env->spr[(ulong)tlbn + 0x2b0] & 0x2000) != 0)) {
    cpu_abort_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,"we don\'t support HES yet\n");
  }
  ppVar2 = booke206_get_tlbm(env,tlbn,(long)(int)env->spr[0x272] & 0xfffffffffffff000,
                             uVar1 >> 0x10 & 0xfff);
  return ppVar2;
}

Assistant:

static ppcmas_tlb_t *booke206_cur_tlb(CPUPPCState *env)
{
    uint32_t tlbncfg = 0;
    int esel = (env->spr[SPR_BOOKE_MAS0] & MAS0_ESEL_MASK) >> MAS0_ESEL_SHIFT;
    int ea = (env->spr[SPR_BOOKE_MAS2] & MAS2_EPN_MASK);
    int tlb;

    tlb = (env->spr[SPR_BOOKE_MAS0] & MAS0_TLBSEL_MASK) >> MAS0_TLBSEL_SHIFT;
    tlbncfg = env->spr[SPR_BOOKE_TLB0CFG + tlb];

    if ((tlbncfg & TLBnCFG_HES) && (env->spr[SPR_BOOKE_MAS0] & MAS0_HES)) {
        cpu_abort(env_cpu(env), "we don't support HES yet\n");
    }

    return booke206_get_tlbm(env, tlb, ea, esel);
}